

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution1d.cpp
# Opt level: O1

float __thiscall embree::Distribution1D::sample(Distribution1D *this,float u)

{
  pointer pfVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  pointer pfVar5;
  ulong uVar6;
  float fVar7;
  undefined1 auVar8 [16];
  
  pfVar1 = (this->CDF).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = this->size;
  pfVar5 = pfVar1;
  while (uVar2 = uVar6, 0 < (long)uVar2) {
    uVar6 = uVar2 >> 1;
    if (pfVar5[uVar6] <= u) {
      pfVar5 = pfVar5 + uVar6 + 1;
      uVar6 = ~uVar6 + uVar2;
    }
  }
  uVar4 = (int)((ulong)((long)pfVar5 - (long)pfVar1) >> 2) - 1;
  uVar3 = (int)this->size - 1;
  if ((int)uVar4 < (int)uVar3) {
    uVar3 = uVar4;
  }
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  fVar7 = pfVar1[(ulong)uVar4 + 1] - pfVar1[uVar4];
  if ((fVar7 == 0.0) && (!NAN(fVar7))) {
    return (float)(int)uVar4;
  }
  auVar8 = rcpss(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
  return (float)(int)uVar4 + (2.0 - fVar7 * auVar8._0_4_) * auVar8._0_4_ * (u - pfVar1[uVar4]);
}

Assistant:

float Distribution1D::sample(const float u) const
  {
    /*! coarse sampling of the distribution */
    const float* pointer = std::upper_bound(CDF.data(), CDF.data()+size, u);
    int index = clamp(int(pointer-CDF.data()-1),0,int(size)-1);

    /*! refine sampling linearly by assuming the distribution being a step function */
    const float dCDF = CDF[index+1] - CDF[index];
    if (dCDF == 0.0f) return float(index);
    float fraction = (u - CDF[index]) * rcp(dCDF);
    return float(index)+fraction;
  }